

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_faceForward_vec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float res;
  float fVar6;
  float local_28 [4];
  float local_18 [6];
  
  fVar5 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  local_18[0] = c->in[1].m_data[3];
  local_18[1] = c->in[1].m_data[2];
  local_18[2] = c->in[1].m_data[1];
  local_18[3] = c->in[1].m_data[0];
  local_28[0] = c->in[2].m_data[0];
  local_28[1] = c->in[2].m_data[3];
  local_28[2] = c->in[2].m_data[2];
  local_28[3] = c->in[2].m_data[1];
  fVar6 = 0.0;
  lVar1 = 0;
  do {
    fVar6 = fVar6 + local_28[lVar1] * local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (0.0 <= fVar6) {
    fVar2 = -fVar2;
    fVar3 = -fVar3;
    fVar4 = -fVar4;
    fVar5 = -fVar5;
  }
  (c->color).m_data[0] = fVar2;
  (c->color).m_data[1] = fVar3;
  (c->color).m_data[2] = fVar4;
  (c->color).m_data[3] = fVar5;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }